

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdf_shake.h
# Opt level: O2

void hash_squeeze_x4_4(hash_context_x4 *ctx,uint8_t *buffer0,uint8_t *buffer1,uint8_t *buffer2,
                      uint8_t *buffer3,size_t buflen)

{
  uint8_t *buffer [4];
  uint8_t *local_28;
  uint8_t *local_20;
  uint8_t *local_18;
  uint8_t *local_10;
  
  local_28 = buffer0;
  local_20 = buffer1;
  local_18 = buffer2;
  local_10 = buffer3;
  Keccak_HashSqueezetimes4(ctx,&local_28,buflen * 8);
  return;
}

Assistant:

static inline void hash_squeeze_x4_4(hash_context_x4* ctx, uint8_t* buffer0, uint8_t* buffer1,
                                     uint8_t* buffer2, uint8_t* buffer3, size_t buflen) {
  uint8_t* buffer[4] = {buffer0, buffer1, buffer2, buffer3};
  hash_squeeze_x4(ctx, buffer, buflen);
}